

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssi.cpp
# Opt level: O2

void __thiscall pg::SSISolver::compute_vals_ll(SSISolver *this,int side)

{
  bitset *src;
  ulong *puVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  uint *puVar6;
  byte bVar7;
  size_t pos;
  ulong uVar8;
  long lVar9;
  long lVar10;
  size_t __n;
  uint *puVar11;
  bool bVar12;
  
  bVar12 = side != 0;
  src = &this->G;
  bitset::operator=(&this->C,src);
  piVar5 = this->first_in;
  lVar9 = ((this->super_Solver).game)->n_vertices;
  for (lVar10 = 0; lVar9 << 2 != lVar10; lVar10 = lVar10 + 4) {
    *(undefined4 *)((long)piVar5 + lVar10) = 0xffffffff;
  }
  for (pos = bitset::find_first(src); pos != 0xffffffffffffffff; pos = bitset::find_next(src,pos)) {
    uVar8 = (ulong)(&this->str0)[bVar12][pos];
    if (((&this->halt0)[bVar12]._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
      piVar5 = this->first_in;
      this->next_in[pos] = piVar5[uVar8];
      piVar5[uVar8] = (uint)pos;
    }
    else {
      iVar2 = (this->Q).pointer;
      (this->Q).pointer = iVar2 + 1;
      (this->Q).queue[iVar2] = (uint)pos;
    }
  }
  while( true ) {
    iVar2 = (this->Q).pointer;
    if ((long)iVar2 == 0) break;
    (this->Q).pointer = iVar2 + -1;
    uVar3 = (this->Q).queue[(long)iVar2 + -1];
    uVar8 = (ulong)(int)uVar3;
    bVar7 = (byte)uVar3 & 0x3f;
    puVar1 = (this->C)._bits + (uVar8 >> 6);
    *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
    iVar2 = this->k;
    piVar5 = this->val + (int)(iVar2 * uVar3);
    iVar4 = (&this->str0)[bVar12][uVar8];
    if (((&this->halt0)[bVar12]._bits[(ulong)(long)iVar4 >> 6] >> ((long)iVar4 & 0x3fU) & 1) == 0) {
      __n = (long)((iVar4 + 1) * iVar2) * 4 + (long)(iVar4 * iVar2) * -4;
      if (__n != 0) {
        memmove(piVar5,this->val + iVar4 * iVar2,__n);
      }
    }
    else {
      for (lVar9 = 0; (long)iVar2 * 4 != lVar9; lVar9 = lVar9 + 4) {
        *(undefined4 *)((long)piVar5 + lVar9) = 0;
      }
    }
    piVar5[((this->super_Solver).game)->_priority[uVar8]] =
         piVar5[((this->super_Solver).game)->_priority[uVar8]] + 1;
    puVar11 = (uint *)(this->first_in + uVar8);
    puVar6 = (this->Q).queue;
    piVar5 = this->next_in;
    while( true ) {
      uVar3 = *puVar11;
      if ((long)(int)uVar3 == -1) break;
      iVar2 = (this->Q).pointer;
      puVar11 = (uint *)(piVar5 + (int)uVar3);
      (this->Q).pointer = iVar2 + 1;
      puVar6[iVar2] = uVar3;
    }
  }
  return;
}

Assistant:

void
SSISolver::compute_vals_ll(int side)
{
    auto & H = side == 0 ? halt0 : halt1;
    auto & S = side == 0 ? str0 : str1;

    // set all vertices in G to "on cycle"
    C = G;

    // find all halting vertices and set the linked list of in edges
    std::fill(first_in, first_in+nodecount(), '\xff');
    for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
        int s = S[v];
        if (H[s]) {
            // successor of v is halted
            Q.push(v);
        } else {
            // successor of v is not halted
            next_in[v] = first_in[s];
            first_in[s] = v;
        }
    }

    // walk the finite paths
    while (Q.nonempty()) {
        int v = Q.pop();

        // mark as not on a cycle
        C[v] = false;

        // set valuation
        int *val_v = val + k*v;
        int s = S[v];
        if (H[s]) {
            std::fill(val_v, val_v+k, '\x00');
        } else {
            std::copy(val+k*s, val+k*(s+1), val_v);
        }
        val_v[priority(v)]++;

        // add predecessors
        int from = first_in[v];
        while (from != -1) {
            Q.push(from);
            from = next_in[from];
        }
    }
}